

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamSequenceDictionary.cpp
# Opt level: O1

void __thiscall
BamTools::SamSequenceDictionary::Add
          (SamSequenceDictionary *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          *sequenceMap)

{
  _Rb_tree_node_base *p_Var1;
  SamSequence SStack_f8;
  
  for (p_Var1 = *(_Rb_tree_node_base **)(sequenceMap + 0x18);
      p_Var1 != (_Rb_tree_node_base *)(sequenceMap + 8);
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    SamSequence::SamSequence(&SStack_f8,(string *)(p_Var1 + 1),(int *)(p_Var1 + 2));
    Add(this,&SStack_f8);
    SamSequence::~SamSequence(&SStack_f8);
  }
  return;
}

Assistant:

void SamSequenceDictionary::Add(const std::map<std::string, int>& sequenceMap)
{
    std::map<std::string, int>::const_iterator seqIter = sequenceMap.begin();
    std::map<std::string, int>::const_iterator seqEnd = sequenceMap.end();
    for (; seqIter != seqEnd; ++seqIter) {
        const std::string& name = (*seqIter).first;
        const int& length = (*seqIter).second;
        Add(SamSequence(name, length));
    }
}